

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O2

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>::
ContIntLoadResidual_F
          (ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_> *this
          ,ChVectorDynamic<> *R,double c)

{
  ChContactable_3vars<3,_3,_3> *pCVar1;
  ChContactable_1vars<6> *pCVar2;
  double dVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  undefined8 local_18;
  
  dVar6 = c * (this->m_force).m_data[0];
  dVar7 = c * (this->m_force).m_data[1];
  dVar3 = c * (this->m_force).m_data[2];
  local_48 = dVar6;
  dStack_40 = dVar7;
  local_38 = dVar3;
  iVar4 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar4 != '\0') {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
             ).objA;
    local_28 = -dVar6;
    dStack_20 = -dVar7;
    auVar5._0_8_ = -dVar3;
    auVar5._8_8_ = 0x8000000000000000;
    local_18 = vmovlpd_avx(auVar5);
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar1,&local_28,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
                ).p1,R);
  }
  iVar4 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar4 != '\0') {
    pCVar2 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
             ).objB;
    (*(pCVar2->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar2,&local_48,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>
                ).p2,R);
  }
  return;
}

Assistant:

virtual void ContIntLoadResidual_F(ChVectorDynamic<>& R, const double c) override {
        ChVector<> abs_force_scaled(m_force * c);

        if (this->objA->IsContactActive())
            this->objA->ContactForceLoadResidual_F(-abs_force_scaled, this->p1, R);

        if (this->objB->IsContactActive())
            this->objB->ContactForceLoadResidual_F(abs_force_scaled, this->p2, R);
    }